

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void TakeInventory(AActor *activator,char *type,int amount)

{
  int iVar1;
  PClassActor *pPVar2;
  char *name;
  int i;
  long lVar3;
  undefined8 *puVar4;
  
  if (0 < amount && type != (char *)0x0) {
    iVar1 = strcmp(type,"Armor");
    name = "BasicArmor";
    if (iVar1 != 0) {
      name = type;
    }
    pPVar2 = PClass::FindActor(name);
    if (pPVar2 != (PClassActor *)0x0) {
      if (activator != (AActor *)0x0) {
        (*(activator->super_DThinker).super_DObject._vptr_DObject[0x1c])
                  (activator,pPVar2,(ulong)(uint)amount,0,0);
        return;
      }
      puVar4 = &players;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        if (playeringame[lVar3] == true) {
          (**(code **)(*(long *)*puVar4 + 0xe0))((long *)*puVar4,pPVar2,amount,0,0);
        }
        puVar4 = puVar4 + 0x54;
      }
    }
  }
  return;
}

Assistant:

static void TakeInventory (AActor *activator, const char *type, int amount)
{
	PClassActor *info;

	if (type == NULL)
	{
		return;
	}
	if (strcmp (type, "Armor") == 0)
	{
		type = "BasicArmor";
	}
	if (amount <= 0)
	{
		return;
	}
	info = PClass::FindActor (type);
	if (info == NULL)
	{
		return;
	}
	if (activator == NULL)
	{
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
				players[i].mo->TakeInventory(info, amount);
		}
	}
	else
	{
		activator->TakeInventory(info, amount);
	}
}